

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O1

bool __thiscall ADSBExchangeConnection::InitCurl(ADSBExchangeConnection *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  curl_slist *pcVar4;
  LTError *this_00;
  string theKey;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  string local_48;
  
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,dataRefs.sADSBExAPIKey._M_dataplus._M_p,
             dataRefs.sADSBExAPIKey._M_dataplus._M_p + dataRefs.sADSBExAPIKey._M_string_length);
  if (local_60 == 0) {
    (this->apiKey)._M_string_length = 0;
    *(this->apiKey)._M_dataplus._M_p = '\0';
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
             ,0x1ab,"InitCurl",logERR,
             "ADS-B Exchange: API Key missing. Get one at rapidapi.com/adsbx/api/adsbexchange-com1 and enter it in Basic Settings."
            );
    }
    CreateMsgWindow(12.0,logERR,
                    "ADS-B Exchange: API Key missing. Get one at rapidapi.com/adsbx/api/adsbexchange-com1 and enter it in Basic Settings."
                   );
    bVar2 = false;
    (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.super_LTChannel.
      _vptr_LTChannel[7])(this,0,1);
    goto LAB_00148a10;
  }
  bVar2 = LTOnlineChannel::InitCurl((LTOnlineChannel *)this);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_00148a10;
  }
  curl_easy_setopt((this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.pCurl,
                   0x4e6f,ReceiveHeader);
  if ((this->slistKey == (curl_slist *)0x0) || (local_60 != (this->apiKey)._M_string_length)) {
LAB_001488f8:
    std::__cxx11::string::_M_assign((string *)&this->apiKey);
    if (this->slistKey != (curl_slist *)0x0) {
      curl_slist_free_all();
      this->slistKey = (curl_slist *)0x0;
    }
    pcVar1 = (this->apiKey)._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (this->apiKey)._M_string_length);
    pcVar4 = MakeCurlSList(&local_48);
    this->slistKey = pcVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else if (local_60 != 0) {
    iVar3 = bcmp(local_68,(this->apiKey)._M_dataplus._M_p,local_60);
    if (iVar3 != 0) goto LAB_001488f8;
  }
  if (this->slistKey == (curl_slist *)0x0) {
    this_00 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                     ,0x1c2,"InitCurl",logFATAL,"ASSERT FAILED: %s","slistKey");
    __cxa_throw(this_00,&LTError::typeinfo,std::logic_error::~logic_error);
  }
  bVar2 = true;
  curl_easy_setopt((this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.pCurl,
                   0x2727);
LAB_00148a10:
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return bVar2;
}

Assistant:

bool ADSBExchangeConnection::InitCurl ()
{
    // we require an API key
    const std::string theKey (dataRefs.GetADSBExAPIKey());
    if (theKey.empty()) {
        apiKey.clear();
        SHOW_MSG(logERR, ERR_ADSBEX_NO_KEY_DEF);
        SetValid(false);
        return false;
    }
    
    // let's do the standard CURL init first
    if (!LTOnlineChannel::InitCurl())
        return false;

    // read headers
    curl_easy_setopt(pCurl, CURLOPT_HEADERFUNCTION, ReceiveHeader);

    // did the API key change?
    if (!slistKey || theKey != apiKey) {
        apiKey = theKey;
        if (slistKey) {
            curl_slist_free_all(slistKey);
            slistKey = NULL;
        }
        slistKey = MakeCurlSList(apiKey);
    }
    
    // now add/overwrite the key
    LOG_ASSERT(slistKey);
    curl_easy_setopt(pCurl, CURLOPT_HTTPHEADER, slistKey);
    return true;
}